

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_0::NegativePartialUpdateTest::init
          (NegativePartialUpdateTest *this,EVP_PKEY_CTX *ctx)

{
  Library *egl_00;
  bool bVar1;
  int iVar2;
  Visibility visibility_;
  NativeDisplay *pNVar3;
  EGLDisplay pvVar4;
  NotSupportedError *this_00;
  EGLConfig pvVar5;
  undefined4 extraout_var;
  NativeDisplayFactory *factory_00;
  CommandLine *pCVar6;
  NativeWindowFactory *pNVar7;
  undefined4 extraout_var_00;
  EGLSurface pvVar8;
  EGLContext pvVar9;
  WindowParams local_7c;
  NativeWindowFactory *local_70;
  NativeWindowFactory *factory;
  EGLint pbufferAttribList [5];
  allocator<char> local_41;
  string local_40;
  undefined4 local_20;
  undefined4 local_1c;
  int height;
  int width;
  Library *egl;
  NegativePartialUpdateTest *this_local;
  
  egl = (Library *)this;
  _height = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1c = 0x1e0;
  local_20 = 0x1e0;
  pNVar3 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar4 = eglu::getAndInitDisplay(pNVar3,(Version *)0x0);
  egl_00 = _height;
  this->m_eglDisplay = pvVar4;
  pvVar4 = this->m_eglDisplay;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"EGL_KHR_partial_update",&local_41);
  bVar1 = eglu::hasExtension(egl_00,pvVar4,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pvVar5 = getEGLConfig(_height,this->m_eglDisplay,this->m_surfaceType,
                          (bool)(this->m_preserveBuffer & 1));
    this->m_eglConfig = pvVar5;
    if (this->m_surfaceType == SURFACETYPE_PBUFFER) {
      factory = (NativeWindowFactory *)0x1e000003057;
      pbufferAttribList[0] = 0x3056;
      pbufferAttribList[1] = 0x1e0;
      pbufferAttribList[2] = 0x3038;
      iVar2 = (*_height->_vptr_Library[10])(_height,this->m_eglDisplay,this->m_eglConfig,&factory);
      this->m_eglSurface = (EGLSurface)CONCAT44(extraout_var,iVar2);
    }
    else {
      factory_00 = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
      pCVar6 = tcu::TestContext::getCommandLine
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      pNVar7 = eglu::selectNativeWindowFactory(factory_00,pCVar6);
      local_70 = pNVar7;
      pNVar3 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
      pvVar4 = this->m_eglDisplay;
      pvVar5 = this->m_eglConfig;
      pCVar6 = tcu::TestContext::getCommandLine
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      visibility_ = eglu::parseWindowVisibility(pCVar6);
      eglu::WindowParams::WindowParams(&local_7c,0x1e0,0x1e0,visibility_);
      iVar2 = (*(pNVar7->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                        (pNVar7,pNVar3,pvVar4,pvVar5,0,&local_7c);
      this->m_window = (NativeWindow *)CONCAT44(extraout_var_00,iVar2);
      pNVar3 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
      pvVar8 = eglu::createWindowSurface
                         (pNVar3,this->m_window,this->m_eglDisplay,this->m_eglConfig,
                          (EGLAttrib *)0x0);
      this->m_eglSurface = pvVar8;
    }
    pvVar9 = initAndMakeCurrentEGLContext
                       (_height,this->m_eglDisplay,this->m_eglSurface,this->m_eglConfig,
                        init::contextAttribList);
    this->m_eglContext = pvVar9;
    return (int)this;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"EGL_KHR_partial_update is not supported",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
             ,0x9e);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void NegativePartialUpdateTest::init (void)
{
	const Library&		egl						= m_eglTestCtx.getLibrary();
	static const EGLint	contextAttribList[]		= { EGL_CONTEXT_CLIENT_VERSION, 2,	EGL_NONE };
	const int			width					= 480;
	const int			height					= 480;

	m_eglDisplay = getAndInitDisplay(m_eglTestCtx.getNativeDisplay());

	if (!hasExtension(egl, m_eglDisplay, "EGL_KHR_partial_update"))
		TCU_THROW(NotSupportedError, "EGL_KHR_partial_update is not supported");

	m_eglConfig = getEGLConfig(egl, m_eglDisplay, m_surfaceType, m_preserveBuffer);

	if (m_surfaceType == SURFACETYPE_PBUFFER)
	{
		const EGLint pbufferAttribList[] = { EGL_WIDTH, width, EGL_HEIGHT, height, EGL_NONE };
		m_eglSurface = egl.createPbufferSurface(m_eglDisplay, m_eglConfig, pbufferAttribList);
	}
	else
	{
		const NativeWindowFactory&	factory	= selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());
		m_window = factory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_eglDisplay, m_eglConfig, DE_NULL,
										WindowParams(width, height, parseWindowVisibility(m_testCtx.getCommandLine())));
		m_eglSurface = createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_window, m_eglDisplay, m_eglConfig, DE_NULL);
	}
	m_eglContext = initAndMakeCurrentEGLContext(egl, m_eglDisplay, m_eglSurface, m_eglConfig, contextAttribList);
}